

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

vm_obj_id_t CVmObjDate::create(int in_root_set,int32_t dayno,int32_t daytime)

{
  vm_obj_id_t obj_id;
  CVmObjDate *this;
  
  obj_id = vm_new_id(in_root_set,0,0);
  this = (CVmObjDate *)CVmObject::operator_new(0x10,obj_id);
  CVmObjDate(this,dayno,daytime);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjDate::create(VMG_ int in_root_set,
                               int32_t dayno, int32_t daytime)
{
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    new (vmg_ id) CVmObjDate(vmg_ dayno, daytime);
    return id;
}